

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplateBase.cpp
# Opt level: O0

char * __thiscall
GeneratedSaxParser::ParserTemplateBase::getNameByStringHash
          (ParserTemplateBase *this,StringHash *hash)

{
  bool bVar1;
  pointer ppVar2;
  long *in_RSI;
  const_iterator it;
  map<unsigned_long,_const_char_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_char_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  char *local_8;
  
  if (*in_RSI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_const_char_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_char_*>_>_>
         ::find(in_stack_ffffffffffffffc8,(key_type *)0xc58964);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_const_char_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_char_*>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator==(local_20,&local_28);
    if (bVar1) {
      local_8 = (char *)0x0;
    }
    else {
      ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_char_*>_>::
               operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_const_char_*>_> *)
                          0xc589a9);
      local_8 = ppVar2->second;
    }
  }
  return local_8;
}

Assistant:

const char* ParserTemplateBase::getNameByStringHash( const StringHash& hash ) const
	{
		if ( hash == 0 )
			return 0;
		ElementNameMap::const_iterator it = mHashNameMap.find(hash);
		if ( it == mHashNameMap.end() )
			return 0;
		else
			return it->second;
	}